

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_vector_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::VolumeMeshVectorQuantity::VolumeMeshVectorQuantity
          (VolumeMeshVectorQuantity *this,string *name,VolumeMesh *mesh_,
          VolumeMeshElement definedOn_)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_40,in_RSI);
  VolumeMeshQuantity::VolumeMeshQuantity
            ((VolumeMeshQuantity *)in_RSI,in_RDX,
             (VolumeMesh *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             (bool)in_stack_ffffffffffffffdf);
  std::__cxx11::string::~string(local_40);
  *in_RDI = &PTR__VolumeMeshVectorQuantity_0098ef70;
  *(undefined4 *)((long)in_RDI + 0x19c) = in_ECX;
  return;
}

Assistant:

VolumeMeshVectorQuantity::VolumeMeshVectorQuantity(std::string name, VolumeMesh& mesh_, VolumeMeshElement definedOn_)
    : VolumeMeshQuantity(name, mesh_), definedOn(definedOn_) {}